

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

qpdf_object_type_e qpdf_oh_get_type_code(qpdf_data qpdf,qpdf_oh oh)

{
  size_t *psVar1;
  undefined1 this [8];
  uint uVar2;
  undefined1 auVar3 [4];
  _Node *p_Var4;
  char *cstr;
  Pipeline *this_00;
  qpdf_object_type_e ret;
  undefined1 local_124 [4];
  undefined1 local_120 [8];
  undefined1 local_118 [24];
  _Invoker_type p_Stack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  undefined4 local_c8;
  int local_c4;
  _Any_data local_c0;
  code *local_b0;
  undefined8 uStack_a8;
  qpdf_oh local_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._M_unused._M_object = &local_c8;
  local_c8 = 0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<qpdf_object_type_e_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<qpdf_object_type_e_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
             ::_M_manager;
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<qpdf_object_type_e_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1097:67)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<qpdf_object_type_e_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1097:67)>
             ::_M_manager;
  std::function<qpdf_object_type_e_()>::function
            ((function<qpdf_object_type_e_()> *)&local_58,
             (function<qpdf_object_type_e_()> *)&local_38);
  std::function<qpdf_object_type_e_(QPDFObjectHandle_&)>::function
            ((function<qpdf_object_type_e_(QPDFObjectHandle_&)> *)&local_c0,
             (function<qpdf_object_type_e_(QPDFObjectHandle_&)> *)&local_e8);
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_a0 = oh;
  local_98._M_unused._M_object = operator_new(0x28);
  *(undefined8 *)local_98._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 0x18) = uStack_a8;
  if (local_b0 != (code *)0x0) {
    *(void **)local_98._M_unused._0_8_ = local_c0._M_unused._M_object;
    *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = local_c0._8_8_;
    *(code **)((long)local_98._M_unused._0_8_ + 0x10) = local_b0;
    local_b0 = (code *)0x0;
    uStack_a8 = 0;
  }
  *(qpdf_oh *)((long)local_98._M_unused._0_8_ + 0x20) = oh;
  pcStack_80 = std::
               _Function_handler<qpdf_object_type_e_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<qpdf_object_type_e_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
             ::_M_manager;
  local_120 = (undefined1  [8])local_124;
  std::function<qpdf_object_type_e_(_qpdf_data_*)>::function
            ((function<qpdf_object_type_e_(_qpdf_data_*)> *)local_118,
             (function<qpdf_object_type_e_(_qpdf_data_*)> *)&local_98);
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x28);
  *(undefined1 (*) [8])local_78._M_unused._0_8_ = local_120;
  *(long *)((long)local_78._M_unused._0_8_ + 8) = 0;
  *(long *)((long)local_78._M_unused._0_8_ + 0x10) = 0;
  *(long *)((long)local_78._M_unused._0_8_ + 0x18) = 0;
  *(_Invoker_type *)((long)local_78._M_unused._0_8_ + 0x20) = p_Stack_100;
  if ((code *)local_118._16_8_ != (code *)0x0) {
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_118._0_8_;
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x10) = local_118._8_8_;
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x18) = local_118._16_8_;
    local_118._16_8_ = (code *)0x0;
    p_Stack_100 = (_Invoker_type)0x0;
  }
  pcStack_60 = std::
               _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
             ::_M_manager;
  uVar2 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((code *)local_118._16_8_ != (code *)0x0) {
    (*(code *)local_118._16_8_)
              ((function<qpdf_object_type_e_(_qpdf_data_*)> *)local_118,
               (function<qpdf_object_type_e_(_qpdf_data_*)> *)local_118,3);
  }
  auVar3 = local_124;
  if (1 < uVar2) {
    if (qpdf->silence_errors == false) {
      if (qpdf->oh_error_occurred == false) {
        local_f8._M_allocated_capacity._0_4_ = 1;
        QPDF::getFilename_abi_cxx11_
                  ((string *)local_120,
                   (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_c4 = 0;
        p_Var4 = std::__cxx11::list<QPDFExc,std::allocator<QPDFExc>>::
                 _M_create_node<qpdf_error_code_e,std::__cxx11::string,char_const(&)[1],int,char_const(&)[129]>
                           ((list<QPDFExc,std::allocator<QPDFExc>> *)&qpdf->warnings,
                            (qpdf_error_code_e *)&local_f8._M_allocated_capacity,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_120,(char (*) [1])0x27aca6,&local_c4,
                            (char (*) [129])
                            "C API function caught an exception that it isn\'t returning; please point the application developer to ERROR HANDLING in qpdf-c.h"
                           );
        std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
        psVar1 = &(qpdf->warnings).super__List_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (local_120 != (undefined1  [8])(local_118 + 8)) {
          operator_delete((void *)local_120,local_118._8_8_ + 1);
        }
        qpdf->oh_error_occurred = true;
      }
      QPDFLogger::defaultLogger();
      QPDFLogger::getError((QPDFLogger *)local_120,SUB41(local_f8._M_allocated_capacity._0_4_,0));
      this = local_120;
      cstr = (char *)(**(code **)(*(long *)(qpdf->error).
                                           super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_ptr + 0x10))();
      this_00 = Pipeline::operator<<((Pipeline *)this,cstr);
      Pipeline::operator<<(this_00,"\n");
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._0_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
      }
    }
    if (local_48 == (code *)0x0) {
      std::__throw_bad_function_call();
    }
    auVar3 = (undefined1  [4])(*local_40)(&local_58);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (local_b0 != (code *)0x0) {
    (*local_b0)(&local_c0,&local_c0,__destroy_functor);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return (qpdf_object_type_e)auVar3;
}

Assistant:

qpdf_object_type_e
qpdf_oh_get_type_code(qpdf_data qpdf, qpdf_oh oh)
{
    return do_with_oh<qpdf_object_type_e>(
        qpdf, oh, return_T<qpdf_object_type_e>(ot_uninitialized), [](QPDFObjectHandle& o) {
            QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_type_code");
            return o.getTypeCode();
        });
}